

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdrloader.cpp
# Opt level: O0

bool decrunch(RGBE *scanline,int len,FILE *file)

{
  int iVar1;
  int iVar2;
  FILE *in_RDX;
  int in_ESI;
  undefined1 *in_RDI;
  uchar val;
  uchar code;
  int j;
  int i;
  FILE *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  int iVar3;
  byte bVar4;
  char cVar5;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar6;
  undefined4 in_stack_ffffffffffffffdc;
  bool local_1;
  
  if ((in_ESI < 8) || (0x7fff < in_ESI)) {
    local_1 = oldDecrunch((RGBE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  }
  else {
    iVar1 = fgetc(in_RDX);
    if (iVar1 == 2) {
      iVar1 = fgetc(in_RDX);
      in_RDI[1] = (char)iVar1;
      iVar1 = fgetc(in_RDX);
      in_RDI[2] = (char)iVar1;
      iVar1 = fgetc(in_RDX);
      if ((in_RDI[1] == '\x02') && ((in_RDI[2] & 0x80) == 0)) {
        for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
          iVar6 = 0;
          while (iVar6 < in_ESI) {
            iVar2 = fgetc(in_RDX);
            iVar3 = iVar2 << 0x18;
            if ((byte)iVar2 < 0x81) {
              while (cVar5 = (char)((uint)iVar3 >> 0x18), iVar3 = (uint)(byte)(cVar5 - 1) << 0x18,
                    cVar5 != '\0') {
                iVar2 = fgetc(in_RDX);
                in_RDI[(long)iVar1 + (long)iVar6 * 4] = (char)iVar2;
                iVar6 = iVar6 + 1;
              }
            }
            else {
              bVar4 = (byte)iVar2 & 0x7f;
              iVar2 = fgetc(in_RDX);
              iVar2 = (uint)CONCAT11(bVar4,(char)iVar2) << 0x10;
              while (cVar5 = (char)((uint)iVar2 >> 0x18), cVar5 != '\0') {
                in_RDI[(long)iVar1 + (long)iVar6 * 4] = (char)((uint)iVar2 >> 0x10);
                iVar2 = CONCAT13(cVar5 + -1,(int3)iVar2);
                iVar6 = iVar6 + 1;
              }
            }
          }
        }
        iVar1 = feof(in_RDX);
        local_1 = iVar1 == 0;
      }
      else {
        *in_RDI = 2;
        in_RDI[3] = (char)iVar1;
        local_1 = oldDecrunch((RGBE *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
                              in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
      }
    }
    else {
      fseek(in_RDX,-1,1);
      local_1 = oldDecrunch((RGBE *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
                            in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
    }
  }
  return local_1;
}

Assistant:

bool decrunch(RGBE *scanline, int len, FILE *file)
{
	int  i, j;
					
	if (len < MINELEN || len > MAXELEN)
		return oldDecrunch(scanline, len, file);

	i = fgetc(file);
	if (i != 2) {
		fseek(file, -1, SEEK_CUR);
		return oldDecrunch(scanline, len, file);
	}

	scanline[0][G] = fgetc(file);
	scanline[0][B] = fgetc(file);
	i = fgetc(file);

	if (scanline[0][G] != 2 || scanline[0][B] & 128) {
		scanline[0][R] = 2;
		scanline[0][E] = i;
		return oldDecrunch(scanline + 1, len - 1, file);
	}

	// read each component
	for (i = 0; i < 4; i++) {
	    for (j = 0; j < len; ) {
			unsigned char code = fgetc(file);
			if (code > 128) { // run
			    code &= 127;
			    unsigned char val = fgetc(file);
			    while (code--)
					scanline[j++][i] = val;
			}
			else  {	// non-run
			    while(code--)
					scanline[j++][i] = fgetc(file);
			}
		}
    }

	return feof(file) ? false : true;
}